

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.c
# Opt level: O1

void cf_logger_write(cf_logger_t *self,cf_char_t *filename,cf_int_t line,cf_char_t *func,
                    cf_log_level_t level,cf_char_t *fmt,...)

{
  cf_void_t *pcVar1;
  char in_AL;
  cf_uint_t cVar2;
  cf_uint_t cVar3;
  cf_logger_t *pcVar4;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  undefined1 local_4e8 [48];
  undefined8 local_4b8;
  undefined8 local_4a8;
  undefined8 local_498;
  undefined8 local_488;
  undefined8 local_478;
  undefined8 local_468;
  undefined8 local_458;
  undefined8 local_448;
  cf_char_t buf [1024];
  
  if (in_AL != '\0') {
    local_4b8 = in_XMM0_Qa;
    local_4a8 = in_XMM1_Qa;
    local_498 = in_XMM2_Qa;
    local_488 = in_XMM3_Qa;
    local_478 = in_XMM4_Qa;
    local_468 = in_XMM5_Qa;
    local_458 = in_XMM6_Qa;
    local_448 = in_XMM7_Qa;
  }
  memset(buf,0,0x400);
  cVar2 = cf_getpid();
  cVar3 = cf_gettid();
  args[0].gp_offset = 0x30;
  args[0].fp_offset = 0x30;
  args[0].overflow_arg_area = &stack0x00000008;
  args[0].reg_save_area = local_4e8;
  vsprintf(buf,fmt,args);
  for (pcVar4 = (cf_logger_t *)(self->sinks).next; pcVar4 != self;
      pcVar4 = (cf_logger_t *)(pcVar4->sinks).next) {
    pcVar1 = (pcVar4->sinks).data;
    if (((pcVar1 != (cf_void_t *)0x0) && (*(code **)((long)pcVar1 + 0x10) != (code *)0x0)) &&
       (self->level <= level)) {
      (**(code **)((long)pcVar1 + 0x10))
                (*(undefined8 *)((long)pcVar1 + 8),cVar2,cVar3,filename,line,func,level,buf);
    }
  }
  return;
}

Assistant:

void cf_logger_write(
    cf_logger_t*        self,
    const cf_char_t*    filename,
    cf_int_t            line,
    const cf_char_t*    func,
    cf_log_level_t      level,
    const cf_char_t*    fmt,
                        ...
) {
    cf_list_iter_t it;
    cf_logger_sink_t* sink = CF_NULL_PTR;
    cf_char_t buf[1024] = {0};
    va_list args;
    cf_uint_t pid = cf_getpid();
    cf_uint_t tid = cf_gettid();

    va_start(args, fmt);
    vsprintf(buf, fmt, args);
    va_end(args);

    for (it = cf_list_iter_init(&self->sinks); !cf_list_iter_end(&self->sinks, it); it = cf_list_iter_next(it)) {
        sink = CF_TYPE_CAST(cf_logger_sink_t*, cf_list_iter_data(it));
        if (sink && sink->write && level >= self->level) {
            sink->write(sink->instance, pid, tid, filename, line, func, level, buf);
        }
    }
}